

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_helper.c
# Opt level: O1

int convert_YCoCg_to_RGB(uchar *orig,int width,int height,int channels)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  uchar uVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  uchar uVar10;
  
  iVar4 = -1;
  if ((((orig != (uchar *)0x0) && (0 < width)) && (0 < height)) && (0xfffffffd < channels - 5U)) {
    iVar4 = height * width;
    if (channels == 3) {
      if (0 < iVar4) {
        uVar9 = 0;
        do {
          bVar1 = orig[uVar9 + 1];
          bVar2 = orig[uVar9 + 2];
          iVar7 = (((uint)orig[uVar9] + (uint)bVar1) - (uint)bVar2) + -0x80;
          if (0x7e < iVar7) {
            iVar7 = 0x7f;
          }
          cVar6 = (char)iVar7;
          if (iVar7 < -0x7f) {
            cVar6 = -0x80;
          }
          iVar7 = (uint)bVar2 + (uint)bVar1 + -0x80;
          if (0xfe < iVar7) {
            iVar7 = 0xff;
          }
          uVar10 = (uchar)iVar7;
          if (iVar7 < 1) {
            uVar10 = '\0';
          }
          iVar7 = (uint)bVar1 - ((uint)orig[uVar9] + (uint)bVar2);
          if (-2 < iVar7) {
            iVar7 = -1;
          }
          orig[uVar9] = cVar6 + 0x80;
          uVar5 = (uchar)iVar7;
          if (iVar7 < -0xff) {
            uVar5 = '\0';
          }
          orig[uVar9 + 1] = uVar10;
          orig[uVar9 + 2] = uVar5;
          uVar9 = uVar9 + 3;
        } while (uVar9 < (uint)(iVar4 * 3));
        return 0;
      }
    }
    else if (0 < iVar4) {
      uVar9 = 0;
      do {
        bVar1 = orig[uVar9];
        bVar2 = orig[uVar9 + 1];
        uVar10 = orig[uVar9 + 2];
        bVar3 = orig[uVar9 + 3];
        iVar7 = ((uint)bVar1 - (uint)bVar2) + (uint)bVar3;
        if (0xfe < iVar7) {
          iVar7 = 0xff;
        }
        uVar5 = (uchar)iVar7;
        if (iVar7 < 1) {
          uVar5 = '\0';
        }
        orig[uVar9] = uVar5;
        iVar7 = (uint)bVar2 + (uint)bVar3 + -0x80;
        if (0xfe < iVar7) {
          iVar7 = 0xff;
        }
        if (iVar7 < 1) {
          iVar7 = 0;
        }
        iVar8 = (uint)bVar3 - ((uint)bVar1 + (uint)bVar2);
        if (-2 < iVar8) {
          iVar8 = -1;
        }
        orig[uVar9 + 1] = (uchar)iVar7;
        uVar5 = (uchar)iVar8;
        if (iVar8 < -0xff) {
          uVar5 = '\0';
        }
        orig[uVar9 + 2] = uVar5;
        orig[uVar9 + 3] = uVar10;
        uVar9 = uVar9 + 4;
      } while (uVar9 < (uint)(iVar4 * 4));
      return 0;
    }
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int
	convert_YCoCg_to_RGB
	(
		unsigned char* orig,
		int width, int height, int channels
	)
{
	int i;
	/*	error check	*/
	if( (width < 1) || (height < 1) ||
		(channels < 3) || (channels > 4) ||
		(orig == NULL) )
	{
		/*	nothing to do	*/
		return -1;
	}
	/*	do the conversion	*/
	if( channels == 3 )
	{
		for( i = 0; i < width*height*3; i += 3 )
		{
			int co = orig[i+0] - 128;
			int y  = orig[i+1];
			int cg = orig[i+2] - 128;
			/*	R	*/
			orig[i+0] = clamp_byte( y + co - cg );
			/*	G	*/
			orig[i+1] = clamp_byte( y + cg );
			/*	B	*/
			orig[i+2] = clamp_byte( y - co - cg );
		}
	} else
	{
		for( i = 0; i < width*height*4; i += 4 )
		{
			int co = orig[i+0] - 128;
			int cg = orig[i+1] - 128;
			unsigned char a  = orig[i+2];
			int y  = orig[i+3];
			/*	R	*/
			orig[i+0] = clamp_byte( y + co - cg );
			/*	G	*/
			orig[i+1] = clamp_byte( y + cg );
			/*	B	*/
			orig[i+2] = clamp_byte( y - co - cg );
			/*	A	*/
			orig[i+3] = a;
		}
	}
	/*	done	*/
	return 0;
}